

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  short sVar1;
  uint uVar2;
  mbedtls_ct_condition_t condition;
  mbedtls_ct_condition_t do_swap;
  int local_28;
  int s;
  int ret;
  uchar swap_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  if (X == Y) {
    X_local._4_4_ = 0;
  }
  else {
    condition = mbedtls_ct_bool((ulong)swap);
    local_28 = mbedtls_mpi_grow(X,(ulong)Y->n);
    if ((local_28 == 0) && (local_28 = mbedtls_mpi_grow(Y,(ulong)X->n), local_28 == 0)) {
      sVar1 = X->s;
      uVar2 = mbedtls_ct_uint_if(condition,(int)Y->s,(int)X->s);
      X->s = (short)uVar2;
      uVar2 = mbedtls_ct_uint_if(condition,(int)sVar1,(int)Y->s);
      Y->s = (short)uVar2;
      mbedtls_mpi_core_cond_swap(X->p,Y->p,(ulong)X->n,condition);
    }
    X_local._4_4_ = local_28;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,
                               mbedtls_mpi *Y,
                               unsigned char swap)
{
    int ret = 0;
    int s;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    if (X == Y) {
        return 0;
    }

    mbedtls_ct_condition_t do_swap = mbedtls_ct_bool(swap);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Y, X->n));

    s = X->s;
    X->s = (int) mbedtls_ct_uint_if(do_swap, Y->s, X->s);
    Y->s = (int) mbedtls_ct_uint_if(do_swap, s, Y->s);

    mbedtls_mpi_core_cond_swap(X->p, Y->p, X->n, do_swap);

cleanup:
    return ret;
}